

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O1

void __thiscall
trng::correlated_normal_dist<double>::param_type::Cholesky_factorization(param_type *this)

{
  double dVar1;
  pointer pdVar2;
  ulong uVar3;
  pointer pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  
  uVar3 = this->d_;
  if (uVar3 != 0) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      dVar9 = 0.0;
      if (uVar6 != 0) {
        pdVar2 = (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = 0;
        pdVar4 = pdVar2;
        do {
          dVar9 = 0.0;
          if (uVar5 != 0) {
            uVar7 = 0;
            do {
              dVar9 = dVar9 + *(double *)((long)pdVar2 + uVar7 * 8 + uVar3 * lVar8) * pdVar4[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
          }
          pdVar2[uVar3 * uVar6 + uVar5] =
               (pdVar2[uVar3 * uVar6 + uVar5] - dVar9) / pdVar2[uVar5 * (uVar3 + 1)];
          uVar5 = uVar5 + 1;
          pdVar4 = pdVar4 + uVar3;
        } while (uVar5 != uVar6);
        dVar9 = 0.0;
        uVar5 = 0;
        do {
          dVar1 = *(double *)
                   ((long)(this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar5 * 8 + uVar3 * lVar8);
          dVar9 = dVar9 + dVar1 * dVar1;
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
      dVar9 = (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(uVar3 + 1) * uVar6] - dVar9;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      pdVar2 = (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = this->d_;
      pdVar2[(uVar3 + 1) * uVar6] = dVar9;
      uVar5 = uVar6 + 1;
      if (uVar5 < uVar3) {
        memset((void *)((long)pdVar2 + uVar3 * uVar6 * 8 + uVar6 * 8 + 8),0,(~uVar6 + uVar3) * 8);
      }
      uVar3 = this->d_;
      lVar8 = lVar8 + 8;
      uVar6 = uVar5;
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

void Cholesky_factorization() {
        for (size_type i{0}; i < d_; ++i) {
          for (size_type k{0}; k < i; ++k) {
            result_type t{0};
            for (size_type j{0}; j < k; ++j)
              t += H_[i * d_ + j] * H_[k * d_ + j];
            H_[i * d_ + k] = (H_[i * d_ + k] - t) / H_[k * d_ + k];
          }
          result_type t{0};
          for (size_type j{0}; j < i; ++j)
            t += H_[i * d_ + j] * H_[i * d_ + j];
          H_[i * d_ + i] = trng::math::sqrt(H_[i * d_ + i] - t);
          for (size_type k{i + 1}; k < d_; ++k)
            H_[i * d_ + k] = 0;
        }
      }